

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_gl.cpp
# Opt level: O3

DWORD __thiscall
FNodeBuilder::AddMiniseg(FNodeBuilder *this,int v1,int v2,DWORD partner,DWORD seg1,DWORD splitseg)

{
  DWORD DVar1;
  DWORD DVar2;
  DWORD DVar3;
  uint uVar4;
  FPrivSeg *pFVar5;
  FPrivVert *pFVar6;
  int local_48;
  
  pFVar5 = (this->Segs).Array;
  if (splitseg == 0xffffffff) {
    local_48 = -1;
  }
  else {
    local_48 = pFVar5[splitseg].planenum;
  }
  pFVar6 = (this->Vertices).Array;
  DVar1 = pFVar6[v1].segs;
  DVar2 = pFVar6[v2].segs2;
  DVar3 = pFVar5[seg1].next;
  TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Grow(&this->Segs,1);
  pFVar5 = (this->Segs).Array;
  uVar4 = (this->Segs).Count;
  pFVar5[uVar4].v1 = v1;
  pFVar5[uVar4].v2 = v2;
  pFVar5[uVar4].sidedef = -1;
  pFVar5[uVar4].linedef = -1;
  pFVar5[uVar4].frontsector = (sector_t_conflict *)0x0;
  (&pFVar5[uVar4].frontsector)[1] = (sector_t_conflict *)0x0;
  pFVar5[uVar4].next = DVar3;
  pFVar5[uVar4].nextforvert = DVar1;
  pFVar5[uVar4].nextforvert2 = DVar2;
  pFVar5[uVar4].loopnum = 0;
  pFVar5[uVar4].partner = partner;
  pFVar5[uVar4].storedseg = 0xffffffff;
  pFVar5[uVar4].planenum = local_48;
  pFVar5[uVar4].planefront = true;
  pFVar5[uVar4].hashnext = (FPrivSeg *)0x0;
  DVar1 = (this->Segs).Count;
  (this->Segs).Count = DVar1 + 1;
  if (partner != 0xffffffff) {
    (this->Segs).Array[partner].partner = DVar1;
  }
  pFVar6 = (this->Vertices).Array;
  pFVar6[v1].segs = DVar1;
  pFVar6[v2].segs2 = DVar1;
  return DVar1;
}

Assistant:

DWORD FNodeBuilder::AddMiniseg (int v1, int v2, DWORD partner, DWORD seg1, DWORD splitseg)
{
	DWORD nseg;
	FPrivSeg *seg = &Segs[seg1];
	FPrivSeg newseg;

	newseg.sidedef = NO_SIDE;
	newseg.linedef = -1;
	newseg.loopnum = 0;
	newseg.next = DWORD_MAX;
	newseg.planefront = true;
	newseg.hashnext = NULL;
	newseg.storedseg = DWORD_MAX;
	newseg.frontsector = NULL;
	newseg.backsector = NULL;

	if (splitseg != DWORD_MAX)
	{
		newseg.planenum = Segs[splitseg].planenum;
	}
	else
	{
		newseg.planenum = -1;
	}

	newseg.v1 = v1;
	newseg.v2 = v2;
	newseg.nextforvert = Vertices[v1].segs;
	newseg.nextforvert2 = Vertices[v2].segs2;
	newseg.next = seg->next;
	if (partner != DWORD_MAX)
	{
		newseg.partner = partner;
	}
	else
	{
		newseg.partner = DWORD_MAX;
	}
	nseg = Segs.Push (newseg);
	if (newseg.partner != DWORD_MAX)
	{
		Segs[partner].partner = nseg;
	}
	Vertices[v1].segs = nseg;
	Vertices[v2].segs2 = nseg;
	//Printf ("Between %d and %d::::\n", seg1, seg2);
	return nseg;
}